

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-lattices.cpp
# Opt level: O2

bool __thiscall wasm::RandomFullLattice::meet(RandomFullLattice *this,Element *a,Element *b)

{
  LatticeImpl *pLVar1;
  variant<bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
  *pvVar2;
  variant<bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
  *pvVar3;
  __index_type _Var4;
  bool bVar5;
  __index_type _Var6;
  __index_type _Var7;
  anon_class_1_0_00000001 local_21;
  
  pLVar1 = (this->lattice)._M_t.
           super___uniq_ptr_impl<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_wasm::RandomFullLattice::LatticeImpl_*,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
           .super__Head_base<0UL,_wasm::RandomFullLattice::LatticeImpl_*,_false>._M_head_impl;
  pvVar2 = (variant<bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
            *)(a->super_unique_ptr<void,_void_(*)(void_*)>)._M_t.
              super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
              super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.super__Head_base<0UL,_void_*,_false>.
              _M_head_impl;
  pvVar3 = (variant<bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
            *)(b->super_unique_ptr<void,_void_(*)(void_*)>)._M_t.
              super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
              super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.super__Head_base<0UL,_void_*,_false>.
              _M_head_impl;
  _Var4 = *(__index_type *)
           ((long)&(pLVar1->super_FullLatticeVariant).
                   super__Variant_base<wasm::analysis::Bool,_wasm::analysis::Integer<unsigned_int>,_wasm::analysis::ValType,_wasm::analysis::Inverted<wasm::RandomFullLattice>,_wasm::analysis::Array<wasm::RandomFullLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomFullLattice>,_wasm::analysis::Tuple<wasm::RandomFullLattice,_wasm::RandomFullLattice>_>
                   .
                   super__Move_assign_alias<wasm::analysis::Bool,_wasm::analysis::Integer<unsigned_int>,_wasm::analysis::ValType,_wasm::analysis::Inverted<wasm::RandomFullLattice>,_wasm::analysis::Array<wasm::RandomFullLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomFullLattice>,_wasm::analysis::Tuple<wasm::RandomFullLattice,_wasm::RandomFullLattice>_>
           + 0x20);
  _Var6 = *(__index_type *)
           ((long)&(pvVar2->
                   super__Variant_base<bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
                   ).
                   super__Move_assign_alias<bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
                   .
                   super__Copy_assign_alias<bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
           + 0x20);
  _Var7 = *(__index_type *)
           ((long)&(pvVar3->
                   super__Variant_base<bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
                   ).
                   super__Move_assign_alias<bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
                   .
                   super__Copy_assign_alias<bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
           + 0x20);
  if (_Var7 == 0xff || (_Var6 == 0xff || _Var4 == 0xff)) {
    std::__throw_bad_variant_access("std::visit: variant is valueless");
    _Var4 = *(__index_type *)
             ((long)&(pLVar1->super_FullLatticeVariant).
                     super__Variant_base<wasm::analysis::Bool,_wasm::analysis::Integer<unsigned_int>,_wasm::analysis::ValType,_wasm::analysis::Inverted<wasm::RandomFullLattice>,_wasm::analysis::Array<wasm::RandomFullLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomFullLattice>,_wasm::analysis::Tuple<wasm::RandomFullLattice,_wasm::RandomFullLattice>_>
                     .
                     super__Move_assign_alias<wasm::analysis::Bool,_wasm::analysis::Integer<unsigned_int>,_wasm::analysis::ValType,_wasm::analysis::Inverted<wasm::RandomFullLattice>,_wasm::analysis::Array<wasm::RandomFullLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomFullLattice>,_wasm::analysis::Tuple<wasm::RandomFullLattice,_wasm::RandomFullLattice>_>
             + 0x20);
    _Var6 = *(__index_type *)
             ((long)&(pvVar2->
                     super__Variant_base<bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
                     ).
                     super__Move_assign_alias<bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
                     .
                     super__Copy_assign_alias<bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
             + 0x20);
    _Var7 = *(__index_type *)
             ((long)&(pvVar3->
                     super__Variant_base<bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
                     ).
                     super__Move_assign_alias<bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
                     .
                     super__Copy_assign_alias<bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
             + 0x20);
  }
  bVar5 = (*std::__detail::__variant::
            __gen_vtable<std::__detail::__variant::__deduce_visit_result<bool>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-fuzz-lattices.cpp:928:5)_&&,_const_std::variant<wasm::analysis::Bool,_wasm::analysis::Integer<unsigned_int>,_wasm::analysis::ValType,_wasm::analysis::Inverted<wasm::RandomFullLattice>,_wasm::analysis::Array<wasm::RandomFullLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomFullLattice>,_wasm::analysis::Tuple<wasm::RandomFullLattice,_wasm::RandomFullLattice>_>_&,_std::variant<bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>_&,_const_std::variant<bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>_&>
            ::_S_vtable._M_arr[(char)_Var4]._M_arr[(char)_Var6]._M_arr[(char)_Var7]._M_data)
                    (&local_21,&pLVar1->super_FullLatticeVariant,pvVar2,pvVar3);
  return bVar5;
}

Assistant:

bool RandomFullLattice::meet(Element& a, const Element& b) const noexcept {
  return std::visit(
    [](const auto& l, auto& elemA, const auto& elemB) -> bool {
      using ElemT = typename bare<decltype(l)>::Element;
      using A = bare<decltype(elemA)>;
      using B = bare<decltype(elemB)>;
      if constexpr (std::is_same_v<ElemT, A> && std::is_same_v<ElemT, B>) {
        return l.meet(elemA, elemB);
      }
      WASM_UNREACHABLE("unexpected element types");
    },
    (const FullLatticeVariant&)*lattice,
    (FullLatticeElementVariant&)*a,
    (const FullLatticeElementVariant&)*b);
}